

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t add_entry(archive_match *a,wchar_t flag,archive_entry *entry)

{
  int iVar1;
  match_file *file;
  char *mbs;
  time_t tVar2;
  long lVar3;
  archive_rb_node *paVar4;
  match_file *f2;
  wchar_t r;
  void *pathname;
  match_file *f;
  archive_entry *entry_local;
  wchar_t flag_local;
  archive_match *a_local;
  
  file = (match_file *)calloc(1,0xb0);
  if (file == (match_file *)0x0) {
    a_local._4_4_ = error_nomem(a);
  }
  else {
    mbs = archive_entry_pathname(entry);
    if (mbs == (char *)0x0) {
      free(file);
      archive_set_error(&a->archive,0x16,"pathname is NULL");
      a_local._4_4_ = L'\xffffffe7';
    }
    else {
      archive_mstring_copy_mbs(&file->pathname,mbs);
      (a->exclusion_tree).rbt_ops = &rb_ops_mbs;
      file->flag = flag;
      tVar2 = archive_entry_mtime(entry);
      file->mtime_sec = tVar2;
      lVar3 = archive_entry_mtime_nsec(entry);
      file->mtime_nsec = lVar3;
      tVar2 = archive_entry_ctime(entry);
      file->ctime_sec = tVar2;
      lVar3 = archive_entry_ctime_nsec(entry);
      file->ctime_nsec = lVar3;
      iVar1 = __archive_rb_tree_insert_node(&a->exclusion_tree,(archive_rb_node *)file);
      if (iVar1 == 0) {
        paVar4 = __archive_rb_tree_find_node(&a->exclusion_tree,mbs);
        if (paVar4 != (archive_rb_node *)0x0) {
          *(wchar_t *)&paVar4[5].rb_info = file->flag;
          paVar4[6].rb_nodes[0] = (archive_rb_node *)file->mtime_sec;
          paVar4[6].rb_nodes[1] = (archive_rb_node *)file->mtime_nsec;
          paVar4[6].rb_info = file->ctime_sec;
          paVar4[7].rb_nodes[0] = (archive_rb_node *)file->ctime_nsec;
        }
        archive_mstring_clean(&file->pathname);
        free(file);
        a_local._4_4_ = L'\0';
      }
      else {
        entry_list_add(&a->exclusion_entry_list,file);
        a->setflag = a->setflag | 2;
        a_local._4_4_ = L'\0';
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
add_entry(struct archive_match *a, int flag,
    struct archive_entry *entry)
{
	struct match_file *f;
	const void *pathname;
	int r;

	f = calloc(1, sizeof(*f));
	if (f == NULL)
		return (error_nomem(a));

#if defined(_WIN32) && !defined(__CYGWIN__)
	pathname = archive_entry_pathname_w(entry);
	if (pathname == NULL) {
		free(f);
		archive_set_error(&(a->archive), EINVAL, "pathname is NULL");
		return (ARCHIVE_FAILED);
	}
	archive_mstring_copy_wcs(&(f->pathname), pathname);
	a->exclusion_tree.rbt_ops = &rb_ops_wcs;
#else
	(void)rb_ops_wcs;
	pathname = archive_entry_pathname(entry);
	if (pathname == NULL) {
		free(f);
		archive_set_error(&(a->archive), EINVAL, "pathname is NULL");
		return (ARCHIVE_FAILED);
	}
	archive_mstring_copy_mbs(&(f->pathname), pathname);
	a->exclusion_tree.rbt_ops = &rb_ops_mbs;
#endif
	f->flag = flag;
	f->mtime_sec = archive_entry_mtime(entry);
	f->mtime_nsec = archive_entry_mtime_nsec(entry);
	f->ctime_sec = archive_entry_ctime(entry);
	f->ctime_nsec = archive_entry_ctime_nsec(entry);
	r = __archive_rb_tree_insert_node(&(a->exclusion_tree), &(f->node));
	if (!r) {
		struct match_file *f2;

		/* Get the duplicated file. */
		f2 = (struct match_file *)__archive_rb_tree_find_node(
			&(a->exclusion_tree), pathname);

		/*
		 * We always overwrite comparison condition.
		 * If you do not want to overwrite it, you should not
		 * call archive_match_exclude_entry(). We cannot know
		 * what behavior you really expect since overwriting
		 * condition might be different with the flag.
		 */
		if (f2 != NULL) {
			f2->flag = f->flag;
			f2->mtime_sec = f->mtime_sec;
			f2->mtime_nsec = f->mtime_nsec;
			f2->ctime_sec = f->ctime_sec;
			f2->ctime_nsec = f->ctime_nsec;
		}
		/* Release the duplicated file. */
		archive_mstring_clean(&(f->pathname));
		free(f);
		return (ARCHIVE_OK);
	}
	entry_list_add(&(a->exclusion_entry_list), f);
	a->setflag |= TIME_IS_SET;
	return (ARCHIVE_OK);
}